

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O1

void jpeg_idct_9x9(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  JSAMPLE *pJVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  int aiStack_158 [74];
  
  pJVar4 = cinfo->sample_range_limit;
  pvVar5 = compptr->dct_table;
  lVar15 = 0;
  do {
    lVar20 = (long)*(short *)((long)pvVar5 + lVar15 * 2) * (long)coef_block[lVar15] * 0x2000;
    lVar26 = (long)*(short *)((long)pvVar5 + lVar15 * 2 + 0x20) * (long)coef_block[lVar15 + 0x10];
    lVar12 = (long)*(short *)((long)pvVar5 + lVar15 * 2 + 0x40) * (long)coef_block[lVar15 + 0x20];
    lVar30 = (long)*(short *)((long)pvVar5 + lVar15 * 2 + 0x60) * (long)coef_block[lVar15 + 0x30];
    lVar23 = lVar30 * 0x16a1 + lVar20 + 0x400;
    lVar18 = lVar30 * -0x2d42 + lVar20 + 0x400;
    lVar31 = (lVar26 - lVar12) * 0x16a1 + lVar18;
    lVar33 = (lVar12 + lVar26) * 0x2a87 + lVar12 * -0x7dc + lVar23;
    lVar13 = lVar23 + (lVar12 + lVar26) * -0x2a87 + lVar26 * 0x22ab;
    lVar24 = lVar23 + lVar26 * -0x22ab + lVar12 * 0x7dc;
    lVar29 = (long)*(short *)((long)pvVar5 + lVar15 * 2 + 0x10) * (long)coef_block[lVar15 + 8];
    lVar28 = (long)*(short *)((long)pvVar5 + lVar15 * 2 + 0x30) * (long)coef_block[lVar15 + 0x18];
    lVar21 = (long)*(short *)((long)pvVar5 + lVar15 * 2 + 0x50) * (long)coef_block[lVar15 + 0x28];
    lVar19 = (long)*(short *)((long)pvVar5 + lVar15 * 2 + 0x70) * (long)coef_block[lVar15 + 0x38];
    lVar23 = lVar28 * -0x2731;
    lVar20 = (lVar21 + lVar29) * 0x1d17;
    lVar14 = lVar23 + (lVar21 - lVar19) * -0x2c91 + lVar20;
    lVar30 = (lVar19 + lVar29) * 0xf7a;
    lVar20 = lVar20 + lVar28 * 0x2731 + lVar30;
    lVar30 = (lVar21 - lVar19) * 0x2c91 + lVar23 + lVar30;
    lVar29 = lVar29 - (lVar19 + lVar21);
    aiStack_158[lVar15] = (int)((ulong)(lVar20 + lVar33) >> 0xb);
    aiStack_158[lVar15 + 0x40] = (int)((ulong)(lVar33 - lVar20) >> 0xb);
    aiStack_158[lVar15 + 8] = (int)((ulong)(lVar29 * 0x2731 + lVar31) >> 0xb);
    aiStack_158[lVar15 + 0x38] = (int)((ulong)(lVar31 + lVar29 * -0x2731) >> 0xb);
    aiStack_158[lVar15 + 0x10] = (int)((ulong)(lVar13 + lVar14) >> 0xb);
    aiStack_158[lVar15 + 0x30] = (int)((ulong)(lVar13 - lVar14) >> 0xb);
    aiStack_158[lVar15 + 0x18] = (int)((ulong)(lVar30 + lVar24) >> 0xb);
    aiStack_158[lVar15 + 0x28] = (int)((ulong)(lVar24 - lVar30) >> 0xb);
    aiStack_158[lVar15 + 0x20] = (int)((ulong)((lVar26 - lVar12) * 0x7ffffffd2be + lVar18) >> 0xb);
    lVar15 = lVar15 + 1;
  } while ((int)lVar15 != 8);
  uVar9 = (ulong)output_col;
  lVar15 = 0;
  do {
    iVar32 = aiStack_158[lVar15 + 1];
    iVar1 = aiStack_158[lVar15 + 2];
    iVar2 = aiStack_158[lVar15 + 4];
    iVar16 = aiStack_158[lVar15 + 6] * 0x16a1 + aiStack_158[lVar15] * 0x2000 + 0x20000;
    iVar6 = aiStack_158[lVar15] * 0x2000 + aiStack_158[lVar15 + 6] * -0x2d42 + 0x20000;
    iVar25 = (iVar1 - iVar2) * 0x16a1 + iVar6;
    iVar11 = (iVar2 + iVar1) * 0x2a87 + iVar2 * -0x7dc + iVar16;
    iVar17 = aiStack_158[lVar15 + 5];
    iVar7 = aiStack_158[lVar15 + 3] * -0x2731;
    iVar22 = iVar16 + (iVar2 + iVar1) * -0x2a87 + iVar1 * 0x22ab;
    iVar3 = aiStack_158[lVar15 + 7];
    iVar10 = (iVar32 + iVar17) * 0x1d17;
    iVar27 = iVar7 + (iVar17 - iVar3) * -0x2c91 + iVar10;
    iVar8 = (iVar3 + iVar32) * 0xf7a;
    iVar10 = iVar10 + aiStack_158[lVar15 + 3] * 0x2731 + iVar8;
    iVar8 = (iVar17 - iVar3) * 0x2c91 + iVar7 + iVar8;
    iVar32 = iVar32 - (iVar17 + iVar3);
    iVar17 = iVar16 + iVar1 * -0x22ab + iVar2 * 0x7dc;
    lVar20 = *(long *)((long)output_buf + lVar15);
    *(JSAMPLE *)(lVar20 + uVar9) = pJVar4[(ulong)((uint)(iVar10 + iVar11) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar20 + 8 + uVar9) =
         pJVar4[(ulong)((uint)(iVar11 - iVar10) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar20 + 1 + uVar9) =
         pJVar4[(ulong)((uint)(iVar32 * 0x2731 + iVar25) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar20 + 7 + uVar9) =
         pJVar4[(ulong)((uint)(iVar25 + iVar32 * -0x2731) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar20 + 2 + uVar9) =
         pJVar4[(ulong)((uint)(iVar27 + iVar22) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar20 + 6 + uVar9) =
         pJVar4[(ulong)((uint)(iVar22 - iVar27) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar20 + 3 + uVar9) =
         pJVar4[(ulong)((uint)(iVar8 + iVar17) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar20 + 5 + uVar9) =
         pJVar4[(ulong)((uint)(iVar17 - iVar8) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar20 + 4 + uVar9) =
         pJVar4[(ulong)((uint)((iVar1 - iVar2) * 0xfffd2be + iVar6) >> 0x12 & 0x3ff) + 0x80];
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0x48);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_9x9(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp2, tmp3, tmp10, tmp11, tmp12, tmp13, tmp14;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 9];         /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp3 = MULTIPLY(z3, FIX(0.707106781));      /* c6 */
    tmp1 = tmp0 + tmp3;
    tmp2 = tmp0 - tmp3 - tmp3;

    tmp0 = MULTIPLY(z1 - z2, FIX(0.707106781)); /* c6 */
    tmp11 = tmp2 + tmp0;
    tmp14 = tmp2 - tmp0 - tmp0;

    tmp0 = MULTIPLY(z1 + z2, FIX(1.328926049)); /* c2 */
    tmp2 = MULTIPLY(z1, FIX(1.083350441));      /* c4 */
    tmp3 = MULTIPLY(z2, FIX(0.245575608));      /* c8 */

    tmp10 = tmp1 + tmp0 - tmp3;
    tmp12 = tmp1 - tmp0 + tmp2;
    tmp13 = tmp1 - tmp2 + tmp3;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    z2 = MULTIPLY(z2, -FIX(1.224744871));            /* -c3 */

    tmp2 = MULTIPLY(z1 + z3, FIX(0.909038955));      /* c5 */
    tmp3 = MULTIPLY(z1 + z4, FIX(0.483689525));      /* c7 */
    tmp0 = tmp2 + tmp3 - z2;
    tmp1 = MULTIPLY(z3 - z4, FIX(1.392728481));      /* c1 */
    tmp2 += z2 - tmp1;
    tmp3 += z2 + tmp1;
    tmp1 = MULTIPLY(z1 - z3 - z4, FIX(1.224744871)); /* c3 */

    /* Final output stage */

    wsptr[8 * 0] = (int)RIGHT_SHIFT(tmp10 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8] = (int)RIGHT_SHIFT(tmp10 - tmp0, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1] = (int)RIGHT_SHIFT(tmp11 + tmp1, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7] = (int)RIGHT_SHIFT(tmp11 - tmp1, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2] = (int)RIGHT_SHIFT(tmp12 + tmp2, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6] = (int)RIGHT_SHIFT(tmp12 - tmp2, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3] = (int)RIGHT_SHIFT(tmp13 + tmp3, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5] = (int)RIGHT_SHIFT(tmp13 - tmp3, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4] = (int)RIGHT_SHIFT(tmp14, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 9 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 9; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);

    z1 = (JLONG)wsptr[2];
    z2 = (JLONG)wsptr[4];
    z3 = (JLONG)wsptr[6];

    tmp3 = MULTIPLY(z3, FIX(0.707106781));      /* c6 */
    tmp1 = tmp0 + tmp3;
    tmp2 = tmp0 - tmp3 - tmp3;

    tmp0 = MULTIPLY(z1 - z2, FIX(0.707106781)); /* c6 */
    tmp11 = tmp2 + tmp0;
    tmp14 = tmp2 - tmp0 - tmp0;

    tmp0 = MULTIPLY(z1 + z2, FIX(1.328926049)); /* c2 */
    tmp2 = MULTIPLY(z1, FIX(1.083350441));      /* c4 */
    tmp3 = MULTIPLY(z2, FIX(0.245575608));      /* c8 */

    tmp10 = tmp1 + tmp0 - tmp3;
    tmp12 = tmp1 - tmp0 + tmp2;
    tmp13 = tmp1 - tmp2 + tmp3;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    z2 = MULTIPLY(z2, -FIX(1.224744871));            /* -c3 */

    tmp2 = MULTIPLY(z1 + z3, FIX(0.909038955));      /* c5 */
    tmp3 = MULTIPLY(z1 + z4, FIX(0.483689525));      /* c7 */
    tmp0 = tmp2 + tmp3 - z2;
    tmp1 = MULTIPLY(z3 - z4, FIX(1.392728481));      /* c1 */
    tmp2 += z2 - tmp1;
    tmp3 += z2 + tmp1;
    tmp1 = MULTIPLY(z1 - z3 - z4, FIX(1.224744871)); /* c3 */

    /* Final output stage */

    outptr[0] = range_limit[(int)RIGHT_SHIFT(tmp10 + tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[8] = range_limit[(int)RIGHT_SHIFT(tmp10 - tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)RIGHT_SHIFT(tmp11 + tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[7] = range_limit[(int)RIGHT_SHIFT(tmp11 - tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)RIGHT_SHIFT(tmp12 + tmp2,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[6] = range_limit[(int)RIGHT_SHIFT(tmp12 - tmp2,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)RIGHT_SHIFT(tmp13 + tmp3,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[5] = range_limit[(int)RIGHT_SHIFT(tmp13 - tmp3,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)RIGHT_SHIFT(tmp14,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}